

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O1

KFLOAT32 * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::operator[](PerimeterPointCoordinate *this,KUINT16 i)

{
  long lVar1;
  KException *this_00;
  int iVar2;
  undefined6 in_register_00000032;
  KString local_40;
  
  lVar1 = 8;
  iVar2 = (int)CONCAT62(in_register_00000032,i);
  if (iVar2 != 0) {
    if (iVar2 != 1) {
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"operator[]","");
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    lVar1 = 0xc;
  }
  return (KFLOAT32 *)((long)&(this->super_DataTypeBase)._vptr_DataTypeBase + lVar1);
}

Assistant:

const KFLOAT32 &PerimeterPointCoordinate::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_f32X;
    case 1:
        return m_f32Y;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}